

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void test_schnorrsig_bip_vectors_check_signing
               (uchar *sk,uchar *pk_serialized,uchar *aux_rand,uchar *msg,size_t msglen,
               uchar *expected_sig)

{
  int iVar1;
  long lVar2;
  secp256k1_keypair *keypair_00;
  size_t msglen_00;
  secp256k1_keypair *keypair_01;
  secp256k1_context *input32;
  int iVar3;
  size_t sVar4;
  secp256k1_keypair *psVar5;
  secp256k1_xonly_pubkey *pubkey;
  uchar sig [64];
  secp256k1_xonly_pubkey pk;
  secp256k1_keypair keypair;
  secp256k1_xonly_pubkey pk_expected;
  secp256k1_xonly_pubkey sStackY_1d8;
  size_t sStackY_198;
  uchar *puStackY_190;
  uchar *puStackY_188;
  code *pcStackY_180;
  secp256k1_schnorrsig_extraparams local_168;
  undefined1 local_148 [64];
  undefined1 local_108 [160];
  char local_68 [64];
  
  local_168.magic[0] = 0xda;
  local_168.magic[1] = 'o';
  local_168.magic[2] = 0xb3;
  local_168.magic[3] = 0x8c;
  local_168._4_4_ = 0;
  local_168.noncefp = (secp256k1_nonce_function_hardened)0x0;
  keypair_01 = (secp256k1_keypair *)(local_108 + 0x40);
  pcStackY_180 = (code *)0x159ff4;
  keypair_00 = (secp256k1_keypair *)msg;
  input32 = CTX;
  sVar4 = msglen;
  local_168.ndata = aux_rand;
  iVar1 = secp256k1_keypair_create(CTX,keypair_01,sk);
  iVar3 = (int)sVar4;
  if (iVar1 == 0) {
    pcStackY_180 = (code *)0x15a12e;
    test_schnorrsig_bip_vectors_check_signing_cold_9();
LAB_0015a12e:
    pcStackY_180 = (code *)0x15a133;
    test_schnorrsig_bip_vectors_check_signing_cold_8();
LAB_0015a133:
    pcStackY_180 = (code *)0x15a138;
    test_schnorrsig_bip_vectors_check_signing_cold_6();
LAB_0015a138:
    pcStackY_180 = (code *)0x15a13d;
    test_schnorrsig_bip_vectors_check_signing_cold_5();
  }
  else {
    keypair_01 = (secp256k1_keypair *)local_148;
    psVar5 = (secp256k1_keypair *)(local_108 + 0x40);
    pcStackY_180 = (code *)0x15a020;
    keypair_00 = (secp256k1_keypair *)msglen;
    input32 = CTX;
    iVar1 = secp256k1_schnorrsig_sign_custom(CTX,(uchar *)keypair_01,msg,msglen,psVar5,&local_168);
    iVar3 = (int)psVar5;
    if (iVar1 == 0) goto LAB_0015a12e;
    lVar2 = 0;
    do {
      keypair_00 = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair_00 >> 8),local_148[lVar2]);
      if (local_148[lVar2] != expected_sig[lVar2]) goto LAB_0015a147;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    if (msglen == 0x20) {
      keypair_01 = (secp256k1_keypair *)local_148;
      local_148[0x30] = '\0';
      local_148[0x31] = '\0';
      local_148[0x32] = '\0';
      local_148[0x33] = '\0';
      local_148[0x34] = '\0';
      local_148[0x35] = '\0';
      local_148[0x36] = '\0';
      local_148[0x37] = '\0';
      local_148[0x38] = '\0';
      local_148[0x39] = '\0';
      local_148[0x3a] = '\0';
      local_148[0x3b] = '\0';
      local_148[0x3c] = '\0';
      local_148[0x3d] = '\0';
      local_148[0x3e] = '\0';
      local_148[0x3f] = '\0';
      local_148[0x20] = '\0';
      local_148[0x21] = '\0';
      local_148[0x22] = '\0';
      local_148[0x23] = '\0';
      local_148[0x24] = '\0';
      local_148[0x25] = '\0';
      local_148[0x26] = '\0';
      local_148[0x27] = '\0';
      local_148[0x28] = '\0';
      local_148[0x29] = '\0';
      local_148[0x2a] = '\0';
      local_148[0x2b] = '\0';
      local_148[0x2c] = '\0';
      local_148[0x2d] = '\0';
      local_148[0x2e] = '\0';
      local_148[0x2f] = '\0';
      local_148[0x10] = '\0';
      local_148[0x11] = '\0';
      local_148[0x12] = '\0';
      local_148[0x13] = '\0';
      local_148[0x14] = '\0';
      local_148[0x15] = '\0';
      local_148[0x16] = '\0';
      local_148[0x17] = '\0';
      local_148[0x18] = '\0';
      local_148[0x19] = '\0';
      local_148[0x1a] = '\0';
      local_148[0x1b] = '\0';
      local_148[0x1c] = '\0';
      local_148[0x1d] = '\0';
      local_148[0x1e] = '\0';
      local_148[0x1f] = '\0';
      local_148[0] = '\0';
      local_148[1] = '\0';
      local_148[2] = '\0';
      local_148[3] = '\0';
      local_148[4] = '\0';
      local_148[5] = '\0';
      local_148[6] = '\0';
      local_148[7] = '\0';
      local_148[8] = '\0';
      local_148[9] = '\0';
      local_148[10] = '\0';
      local_148[0xb] = '\0';
      local_148[0xc] = '\0';
      local_148[0xd] = '\0';
      local_148[0xe] = '\0';
      local_148[0xf] = '\0';
      psVar5 = (secp256k1_keypair *)(local_108 + 0x40);
      keypair_00 = (secp256k1_keypair *)0x20;
      pcStackY_180 = (code *)0x15a085;
      input32 = CTX;
      iVar1 = secp256k1_schnorrsig_sign_internal
                        (CTX,(uchar *)keypair_01,msg,0x20,psVar5,nonce_function_bip340,aux_rand);
      iVar3 = (int)psVar5;
      if (iVar1 == 0) goto LAB_0015a142;
      lVar2 = 0;
      do {
        keypair_00 = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair_00 >> 8),local_148[lVar2]);
        if (local_148[lVar2] != expected_sig[lVar2]) goto LAB_0015a151;
        lVar2 = lVar2 + 1;
      } while (lVar2 != 0x40);
    }
    keypair_01 = (secp256k1_keypair *)local_68;
    pcStackY_180 = (code *)0x15a0bd;
    input32 = CTX;
    iVar1 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)keypair_01,pk_serialized);
    if (iVar1 == 0) goto LAB_0015a133;
    keypair_01 = (secp256k1_keypair *)local_108;
    keypair_00 = (secp256k1_keypair *)(local_108 + 0x40);
    pcStackY_180 = (code *)0x15a0dc;
    input32 = CTX;
    iVar1 = secp256k1_keypair_xonly_pub
                      (CTX,(secp256k1_xonly_pubkey *)keypair_01,(int *)0x0,keypair_00);
    if (iVar1 == 0) goto LAB_0015a138;
    lVar2 = 0;
    do {
      keypair_00 = (secp256k1_keypair *)CONCAT71((int7)((ulong)keypair_00 >> 8),local_108[lVar2]);
      if (local_108[lVar2] != local_68[lVar2]) goto LAB_0015a14c;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
    keypair_01 = (secp256k1_keypair *)local_148;
    pubkey = (secp256k1_xonly_pubkey *)local_108;
    pcStackY_180 = (code *)0x15a114;
    keypair_00 = (secp256k1_keypair *)msglen;
    input32 = CTX;
    iVar1 = secp256k1_schnorrsig_verify(CTX,(uchar *)keypair_01,msg,msglen,pubkey);
    iVar3 = (int)pubkey;
    if (iVar1 != 0) {
      return;
    }
  }
  pcStackY_180 = (code *)0x15a142;
  test_schnorrsig_bip_vectors_check_signing_cold_4();
LAB_0015a142:
  pcStackY_180 = (code *)0x15a147;
  test_schnorrsig_bip_vectors_check_signing_cold_7();
LAB_0015a147:
  pcStackY_180 = (code *)0x15a14c;
  test_schnorrsig_bip_vectors_check_signing_cold_1();
LAB_0015a14c:
  pcStackY_180 = (code *)0x15a151;
  test_schnorrsig_bip_vectors_check_signing_cold_3();
LAB_0015a151:
  pcStackY_180 = test_schnorrsig_bip_vectors_check_verify;
  test_schnorrsig_bip_vectors_check_signing_cold_2();
  sStackY_198 = msglen;
  puStackY_190 = expected_sig;
  puStackY_188 = msg;
  pcStackY_180 = (code *)pk_serialized;
  iVar1 = secp256k1_xonly_pubkey_parse(CTX,&sStackY_1d8,(uchar *)input32);
  if (iVar1 == 0) {
    test_schnorrsig_bip_vectors_check_verify_cold_2();
  }
  else {
    iVar1 = secp256k1_schnorrsig_verify
                      (CTX,keypair_00->data,keypair_01->data,msglen_00,&sStackY_1d8);
    if (iVar1 == iVar3) {
      return;
    }
  }
  test_schnorrsig_bip_vectors_check_verify_cold_1();
  return;
}

Assistant:

static void test_schnorrsig_bip_vectors_check_signing(const unsigned char *sk, const unsigned char *pk_serialized, const unsigned char *aux_rand, const unsigned char *msg, size_t msglen, const unsigned char *expected_sig) {
    unsigned char sig[64];
    secp256k1_keypair keypair;
    secp256k1_xonly_pubkey pk, pk_expected;

    secp256k1_schnorrsig_extraparams extraparams = SECP256K1_SCHNORRSIG_EXTRAPARAMS_INIT;
    extraparams.ndata = (unsigned char*)aux_rand;

    CHECK(secp256k1_keypair_create(CTX, &keypair, sk));
    CHECK(secp256k1_schnorrsig_sign_custom(CTX, sig, msg, msglen, &keypair, &extraparams));
    CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    if (msglen == 32) {
        memset(sig, 0, 64);
        CHECK(secp256k1_schnorrsig_sign32(CTX, sig, msg, &keypair, aux_rand));
        CHECK(secp256k1_memcmp_var(sig, expected_sig, 64) == 0);
    }

    CHECK(secp256k1_xonly_pubkey_parse(CTX, &pk_expected, pk_serialized));
    CHECK(secp256k1_keypair_xonly_pub(CTX, &pk, NULL, &keypair));
    CHECK(secp256k1_memcmp_var(&pk, &pk_expected, sizeof(pk)) == 0);
    CHECK(secp256k1_schnorrsig_verify(CTX, sig, msg, msglen, &pk));
}